

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void encode_message(upb_encstate *e,upb_Message *msg,upb_MiniTable *m,size_t *size)

{
  upb_MiniTableField *field;
  byte bVar1;
  ushort uVar2;
  undefined8 *puVar3;
  upb_MiniTableField *puVar4;
  upb_MessageValue ext_val;
  size_t sVar5;
  _Bool _Var6;
  upb_Message_Internal *in;
  ulong uVar7;
  char *__dest;
  upb_MiniTableField *puVar8;
  long lVar9;
  uintptr_t iter;
  int local_78;
  upb_StringView unknown;
  upb_MiniTableExtension *ext;
  upb_MiniTable *local_58;
  char *local_50;
  char *local_48;
  size_t *local_40;
  uintptr_t iter_1;
  
  local_48 = e->ptr;
  local_50 = e->limit;
  if (((e->options & 4U) != 0) &&
     (bVar1 = m->required_count_dont_copy_me__upb_internal_use_only, bVar1 != 0)) {
    if (0x40 < bVar1) {
      __assert_fail("0 < n && n <= 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/message.h"
                    ,0xb3,
                    "uint64_t _upb_MiniTable_RequiredMask_dont_copy_me__upb_internal_use_only(const struct upb_MiniTable *)"
                   );
    }
    if ((-1L << (bVar1 & 0x3f) | msg[1].field_0.internal_opaque) != 0xffffffffffffffff) {
      encode_err(e,kUpb_EncodeStatus_MissingRequired);
    }
  }
  local_40 = size;
  if ((e->options & 2U) == 0) {
    iter = 0;
    uVar7 = 0;
    local_58 = m;
    while (_Var6 = upb_Message_NextUnknown(msg,&unknown,&iter), _Var6) {
      uVar7 = uVar7 + unknown.size;
    }
    m = local_58;
    if (uVar7 != 0) {
      if ((ulong)((long)e->ptr - (long)e->buf) < uVar7) {
        encode_growbuffer(e,uVar7);
        __dest = e->ptr;
      }
      else {
        __dest = e->ptr + -uVar7;
        e->ptr = __dest;
      }
      iter = 0;
      while (_Var6 = upb_Message_NextUnknown(msg,&unknown,&iter), sVar5 = unknown.size, m = local_58
            , _Var6) {
        memcpy(__dest,unknown.data,unknown.size);
        __dest = __dest + sVar5;
      }
    }
  }
  if ((m->ext_dont_copy_me__upb_internal_use_only != '\0') &&
     (in = (upb_Message_Internal *)((msg->field_0).internal_opaque & 0xfffffffffffffffe),
     in != (upb_Message_Internal *)0x0)) {
    iter_1 = 0;
    _Var6 = _upb_Message_NextExtensionReverse_dont_copy_me__upb_internal_use_only
                      (msg,&ext,(upb_MessageValue *)&unknown,&iter_1);
    if (_Var6) {
      if ((e->options & 1) == 0) {
        do {
          ext_val.str_val.size = unknown.size;
          ext_val.str_val.data = unknown.data;
          encode_ext(e,ext,ext_val,m->ext_dont_copy_me__upb_internal_use_only == '\x02');
          _Var6 = _upb_Message_NextExtensionReverse_dont_copy_me__upb_internal_use_only
                            (msg,&ext,(upb_MessageValue *)&unknown,&iter_1);
        } while (_Var6);
      }
      else {
        _upb_mapsorter_pushexts(&e->sorter,in,(_upb_sortedmap *)&iter);
        while( true ) {
          lVar9 = (long)iter._4_4_;
          if (iter._4_4_ == local_78) break;
          iter = CONCAT44(iter._4_4_ + 1,(int)iter);
          puVar3 = (undefined8 *)(e->sorter).entries[lVar9];
          encode_ext(e,(upb_MiniTableExtension *)*puVar3,*(upb_MessageValue *)(puVar3 + 1),
                     m->ext_dont_copy_me__upb_internal_use_only == '\x02');
        }
        (e->sorter).size = (int)iter;
      }
    }
  }
  uVar7 = (ulong)m->field_count_dont_copy_me__upb_internal_use_only;
  if (uVar7 != 0) {
    puVar4 = m->fields_dont_copy_me__upb_internal_use_only;
    puVar8 = puVar4 + uVar7;
    for (lVar9 = uVar7 * 0xc; lVar9 != 0; lVar9 = lVar9 + -0xc) {
      field = (upb_MiniTableField *)
              ((long)&puVar4[-1].number_dont_copy_me__upb_internal_use_only + lVar9);
      uVar2 = puVar8[-1].presence;
      if (uVar2 == 0) {
        (*(code *)(&DAT_0043a40c +
                  *(int *)(&DAT_0043a40c + (ulong)(*(byte *)((long)puVar4 + lVar9 + -1) >> 6) * 4)))
                  ();
        return;
      }
      if ((short)uVar2 < 1) {
        if (*(uint32_t *)((long)&msg->field_0 + (ulong)(uVar2 ^ 0xffff)) ==
            field->number_dont_copy_me__upb_internal_use_only) goto LAB_002bc53c;
      }
      else if ((*(byte *)((long)&msg->field_0 + (ulong)(uVar2 >> 3)) >> (uVar2 & 7) & 1) != 0) {
LAB_002bc53c:
        encode_field(e,msg,m->subs_dont_copy_me__upb_internal_use_only,field);
      }
      puVar8 = puVar8 + -1;
    }
  }
  *local_40 = (long)(local_48 + (long)e->limit) - (long)(local_50 + (long)e->ptr);
  return;
}

Assistant:

static void encode_message(upb_encstate* e, const upb_Message* msg,
                           const upb_MiniTable* m, size_t* size) {
  size_t pre_len = e->limit - e->ptr;

  if (e->options & kUpb_EncodeOption_CheckRequired) {
    if (m->UPB_PRIVATE(required_count)) {
      if (!UPB_PRIVATE(_upb_Message_IsInitializedShallow)(msg, m)) {
        encode_err(e, kUpb_EncodeStatus_MissingRequired);
      }
    }
  }

  if ((e->options & kUpb_EncodeOption_SkipUnknown) == 0) {
    size_t unknown_size = 0;
    uintptr_t iter = kUpb_Message_UnknownBegin;
    upb_StringView unknown;
    // Need to write in reverse order, but iteration is in-order; scan to
    // reserve capacity up front, then write in-order
    while (upb_Message_NextUnknown(msg, &unknown, &iter)) {
      unknown_size += unknown.size;
    }
    if (unknown_size != 0) {
      encode_reserve(e, unknown_size);
      char* ptr = e->ptr;
      iter = kUpb_Message_UnknownBegin;
      while (upb_Message_NextUnknown(msg, &unknown, &iter)) {
        memcpy(ptr, unknown.data, unknown.size);
        ptr += unknown.size;
      }
    }
  }

  encode_exts(e, m, msg);

  if (upb_MiniTable_FieldCount(m)) {
    const upb_MiniTableField* f =
        &m->UPB_PRIVATE(fields)[m->UPB_PRIVATE(field_count)];
    const upb_MiniTableField* first = &m->UPB_PRIVATE(fields)[0];
    while (f != first) {
      f--;
      if (encode_shouldencode(e, msg, f)) {
        encode_field(e, msg, m->UPB_PRIVATE(subs), f);
      }
    }
  }

  *size = (e->limit - e->ptr) - pre_len;
}